

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O3

int coda_bin_cursor_read_string(coda_cursor_conflict *cursor,char *dst,long dst_size)

{
  int64_t bit_offset;
  int iVar1;
  coda_type *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t bit_size;
  char s2 [21];
  char s1 [21];
  ulong local_70;
  char local_68 [32];
  char local_48 [32];
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  bit_offset = cursor->stack[(long)cursor->n + -1].bit_offset;
  uVar3 = pcVar2->bit_size;
  if (pcVar2->bit_size < 0) {
    iVar1 = coda_bin_cursor_get_bit_size(cursor,(int64_t *)&local_70);
    if (iVar1 == 0) {
      if ((long)local_70 < 0) {
        coda_str64(local_70,local_48);
        coda_str64(cursor->stack[(long)cursor->n + -1].bit_offset >> 3,local_68);
        coda_set_error(-300,
                       "possible product error detected (invalid bit size (%s) for binary string - byte:bit offset = %s:%d)"
                       ,local_48,local_68,
                       (ulong)((uint)cursor->stack[(long)cursor->n + -1].bit_offset & 7));
      }
      else {
        uVar3 = local_70;
        if ((local_70 & 7) == 0) goto LAB_00152109;
        coda_set_error(-300,"product error detected (text does not have a rounded byte size)");
      }
    }
    iVar1 = -1;
  }
  else {
LAB_00152109:
    uVar4 = dst_size - 1;
    if ((long)(uVar3 >> 3) < dst_size) {
      uVar4 = uVar3 >> 3;
    }
    if ((long)uVar4 < 1) {
      *dst = '\0';
    }
    else {
      iVar1 = read_bits(cursor->product,bit_offset,uVar4 * 8,(uint8_t *)dst);
      if (iVar1 != 0) {
        return -1;
      }
      dst[uVar4] = '\0';
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int coda_bin_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t read_size = 0;

    if (type->bit_size < 0)
    {
        int64_t bit_size;

        if (coda_bin_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if (bit_size < 0)
        {
            char s1[21];
            char s2[21];

            coda_str64(bit_size, s1);
            coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s2);
            coda_set_error(CODA_ERROR_PRODUCT,
                           "possible product error detected (invalid bit size (%s) for binary string - "
                           "byte:bit offset = %s:%d)", s1, s2, (int)(cursor->stack[cursor->n - 1].bit_offset & 0x7));
            return -1;
        }
        if ((bit_size & 0x7) != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not have a rounded byte size)");
            return -1;
        }
        read_size = bit_size >> 3;
    }
    else
    {
        read_size = type->bit_size >> 3;
    }
    if (read_size + 1 > dst_size)       /* account for terminating zero */
    {
        read_size = dst_size - 1;
    }
    if (read_size > 0)
    {
        if (read_bits(cursor->product, bit_offset, 8 * read_size, (uint8_t *)dst) != 0)
        {
            return -1;
        }
        dst[read_size] = '\0';
    }
    else
    {
        dst[0] = '\0';
    }

    return 0;
}